

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferMAXSizeValidation.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TextureBufferMAXSizeValidation::iterate(TextureBufferMAXSizeValidation *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  int *piVar6;
  uint uVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  bool bVar8;
  bool bVar9;
  GLint textureSize;
  GLint textureOffset;
  int local_1b8;
  int local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  initTest(this);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_1b4 = -1;
  (**(code **)(lVar5 + 0xab0))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
             (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER_OFFSET,&local_1b4);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error getting texture buffer offset parameter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xbd);
  bVar8 = local_1b4 != 0;
  if (bVar8) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expected GL_TEXTURE_BUFFER_OFFSET_EXT parameter value : ",0x38);
    std::ostream::operator<<(poVar1,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Result   GL_TEXTURE_BUFFER_OFFSET_EXT parameter value : ",0x38);
    std::ostream::operator<<(poVar1,local_1b4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  local_1b8 = 0;
  (**(code **)(lVar5 + 0xab0))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
             (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER_SIZE,&local_1b8);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error getting texture buffer paramter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xce);
  iVar2 = this->m_max_tex_buffer_size;
  bVar9 = iVar2 != local_1b8;
  if (bVar9) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expected GL_TEXTURE_BUFFER_SIZE_EXT parameter value : ",0x36);
    std::ostream::operator<<(poVar1,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Result   GL_TEXTURE_BUFFER_SIZE_EXT parameter value : ",0x36);
    std::ostream::operator<<(poVar1,local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  (**(code **)(lVar5 + 0x1680))(this->m_po_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error setting program!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xdd);
  (**(code **)(lVar5 + 0x48))(0x90d2,0,this->m_ssbo_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Could not bind buffer object to shader storage binding point!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xe0);
  (**(code **)(lVar5 + 8))(0x84c0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error activating texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xe3);
  (**(code **)(lVar5 + 0xb8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xe6);
  uVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"sampler_buffer");
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error getting uniform location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xe9);
  (**(code **)(lVar5 + 0x14f0))(uVar4,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error setting value for uniform location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xec);
  (**(code **)(lVar5 + 0x528))(1,1,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error running compute shader!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xef);
  (**(code **)(lVar5 + 0xdb8))(0x200);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error setting memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xf2);
  piVar6 = (int *)(**(code **)(lVar5 + 0xd00))(0x90d2,0,0xc,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error mapping buffer object to client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xf7);
  iVar2 = this->m_max_tex_buffer_size;
  uVar7 = iVar2 + 0xfe;
  if (-1 < (int)(iVar2 - 1U)) {
    uVar7 = iVar2 - 1U;
  }
  if (((*piVar6 == iVar2) && (piVar6[1] == 0)) && (piVar6[2] == (iVar2 - (uVar7 & 0xffffff00)) + -1)
     ) {
    if (!bVar9 && !bVar8) {
      this_00 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00d68662;
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Result is different than expected\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expected size:                            ",0x2a);
    std::ostream::operator<<(poVar1,this->m_max_tex_buffer_size);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Result value  (textureSize):              ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expected Value (for index 0)              ",0x2a);
    std::ostream::operator<<(poVar1,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Result value                              ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ExpectedValue (for last index)            ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Result value                              ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  this_00 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00d68662:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  (**(code **)(lVar5 + 0x1670))(0x90d2);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferMAXSizeValidation::iterate(void)
{
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool testResult = true;

	glw::GLint textureOffset = -1;

	gl.getTexLevelParameteriv(m_glExtTokens.TEXTURE_BUFFER, 0, m_glExtTokens.TEXTURE_BUFFER_OFFSET, &textureOffset);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting texture buffer offset parameter value!");

	/* Check if offset is equal to 0 */
	const int expectedOffset = 0;

	if (expectedOffset != textureOffset)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Expected GL_TEXTURE_BUFFER_OFFSET_EXT parameter value : " << expectedOffset << "\n"
						   << "Result   GL_TEXTURE_BUFFER_OFFSET_EXT parameter value : " << textureOffset << "\n"
						   << tcu::TestLog::EndMessage;
		testResult = false;
	}

	glw::GLint textureSize = 0;

	gl.getTexLevelParameteriv(m_glExtTokens.TEXTURE_BUFFER, 0, m_glExtTokens.TEXTURE_BUFFER_SIZE, &textureSize);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting texture buffer paramter value!");

	/* Check if texture size is equal to m_max_tex_buffer_size * sizeof(glw::GLubyte) */
	glw::GLint expectedSize = static_cast<glw::GLint>(m_max_tex_buffer_size * sizeof(glw::GLubyte));

	if (expectedSize != textureSize)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Expected GL_TEXTURE_BUFFER_SIZE_EXT parameter value : " << expectedSize << "\n"
						   << "Result   GL_TEXTURE_BUFFER_SIZE_EXT parameter value : " << textureSize << "\n"
						   << tcu::TestLog::EndMessage;
		testResult = false;
	}

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting program!");

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object to shader storage binding point!");

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error activating texture unit!");

	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	glw::GLint location = gl.getUniformLocation(m_po_id, "sampler_buffer");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting uniform location!");

	gl.uniform1i(location, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for uniform location!");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error running compute shader!");

	gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

	/* Get result data */
	glw::GLuint* result = (glw::GLuint*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0,
														  m_n_vec_components * sizeof(glw::GLuint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object to client's address space!");

	glw::GLuint expectedValue = (m_max_tex_buffer_size - 1) % 256;
	/* Log error if expected values and result data are not equal */
	if (result[0] != (glw::GLuint)m_max_tex_buffer_size || result[1] != 0 || result[2] != expectedValue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Result is different than expected\n"
						   << "Expected size:                            " << m_max_tex_buffer_size << "\n"
						   << "Result value  (textureSize):              " << result[0] << "\n"
						   << "Expected Value (for index 0)              " << 0 << "\n"
						   << "Result value                              " << result[1] << "\n"
						   << "ExpectedValue (for last index)            " << expectedValue << "\n"
						   << "Result value                              " << result[2] << "\n"
						   << tcu::TestLog::EndMessage;

		testResult = false;
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);

	return STOP;
}